

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  UnitTest *pUVar4;
  string *psVar5;
  string *in_RDI;
  string local_278 [32];
  FilePath local_258;
  undefined1 local_238 [8];
  FilePath result;
  string local_210;
  FilePath local_1f0;
  allocator local_1c9;
  string local_1c8;
  FilePath local_1a8;
  FilePath local_188;
  allocator local_161;
  string local_160;
  undefined1 local_140 [8];
  FilePath output_name;
  string local_118;
  FilePath local_f8;
  allocator local_d1;
  string local_d0;
  FilePath local_b0;
  FilePath local_90;
  char *local_70;
  char *colon;
  string local_60 [32];
  string local_40 [8];
  string format;
  char *gtest_output_flag;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  if (pcVar2 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)in_RDI,"",(allocator *)(format.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(format.field_2._M_local_buf + 0xf));
  }
  else {
    GetOutputFormat_abi_cxx11_();
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"xml",(allocator *)((long)&colon + 7));
      std::__cxx11::string::operator=(local_40,local_60);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)((long)&colon + 7));
    }
    local_70 = strchr(pcVar2,0x3a);
    if (local_70 == (char *)0x0) {
      pUVar4 = UnitTest::GetInstance();
      pcVar2 = UnitTest::original_working_dir(pUVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d0,pcVar2,&local_d1);
      FilePath::FilePath(&local_b0,&local_d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_118,"test_detail",
                 (allocator *)(output_name.pathname_.field_2._M_local_buf + 0xf));
      FilePath::FilePath(&local_f8,&local_118);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      FilePath::MakeFileName(&local_90,&local_b0,&local_f8,0,pcVar2);
      psVar5 = FilePath::string_abi_cxx11_(&local_90);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
      FilePath::~FilePath(&local_90);
      FilePath::~FilePath(&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator
                ((allocator<char> *)(output_name.pathname_.field_2._M_local_buf + 0xf));
      FilePath::~FilePath(&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      output_name.pathname_.field_2._8_4_ = 1;
    }
    else {
      pcVar2 = local_70 + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_160,pcVar2,&local_161);
      FilePath::FilePath((FilePath *)local_140,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
      bVar1 = FilePath::IsAbsolutePath((FilePath *)local_140);
      if (!bVar1) {
        pUVar4 = UnitTest::GetInstance();
        pcVar2 = UnitTest::original_working_dir(pUVar4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1c8,pcVar2,&local_1c9);
        FilePath::FilePath(&local_1a8,&local_1c8);
        pcVar2 = local_70 + 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_210,pcVar2,
                   (allocator *)(result.pathname_.field_2._M_local_buf + 0xf));
        FilePath::FilePath(&local_1f0,&local_210);
        FilePath::ConcatPaths(&local_188,&local_1a8,&local_1f0);
        FilePath::operator=((FilePath *)local_140,&local_188);
        FilePath::~FilePath(&local_188);
        FilePath::~FilePath(&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(result.pathname_.field_2._M_local_buf + 0xf));
        FilePath::~FilePath(&local_1a8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      }
      bVar1 = FilePath::IsDirectory((FilePath *)local_140);
      if (bVar1) {
        GetCurrentExecutableName();
        GetOutputFormat_abi_cxx11_();
        pcVar2 = (char *)std::__cxx11::string::c_str();
        FilePath::GenerateUniqueFileName
                  ((FilePath *)local_238,(FilePath *)local_140,&local_258,pcVar2);
        std::__cxx11::string::~string(local_278);
        FilePath::~FilePath(&local_258);
        psVar5 = FilePath::string_abi_cxx11_((FilePath *)local_238);
        std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
        output_name.pathname_.field_2._8_4_ = 1;
        FilePath::~FilePath((FilePath *)local_238);
      }
      else {
        psVar5 = FilePath::string_abi_cxx11_((FilePath *)local_140);
        std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
        output_name.pathname_.field_2._8_4_ = 1;
      }
      FilePath::~FilePath((FilePath *)local_140);
    }
    std::__cxx11::string::~string(local_40);
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL)
    return "";

  std::string format = GetOutputFormat();
  if (format.empty())
    format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == NULL)
    return internal::FilePath::MakeFileName(
        internal::FilePath(
            UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(kDefaultOutputFile), 0,
        format.c_str()).string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    // TODO(wan@google.com): on Windows \some\path is not an absolute
    // path (as its meaning depends on the current drive), yet the
    // following logic for turning it into an absolute path is wrong.
    // Fix it.
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}